

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O0

VectorNd * __thiscall
UnitBoundedPolynomial<5U,_3U>::derivative(UnitBoundedPolynomial<5U,_3U> *this,double t)

{
  Scalar *pSVar1;
  long in_RSI;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  int k;
  VectorNd *d;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *this_00;
  undefined4 local_1c;
  
  this_00 = in_RDI;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x119460);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    dVar2 = UnitBoundedPolynomial1<5U>::derivative
                      ((UnitBoundedPolynomial1<5U> *)(in_RSI + (long)(int)local_1c * 0x30),
                       in_XMM0_Qa);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (this_00,(Index)in_RDI);
    *pSVar1 = dVar2;
  }
  return (VectorNd *)this_00;
}

Assistant:

typename UnitBoundedPolynomial<Order, Dims>::VectorNd UnitBoundedPolynomial<Order, Dims>::derivative(double t) const
{
    VectorNd d;

    for (int k = 0; k < Dims; ++k)
    {
        d[k] = _dims[k].derivative(t);
    }

    return d;
}